

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_on_begin_headers(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((session->callbacks).on_begin_headers_callback != (nghttp2_on_begin_headers_callback)0x0) {
    iVar1 = (*(session->callbacks).on_begin_headers_callback)(session,frame,session->user_data);
    if (iVar1 == -0x209) {
      return -0x209;
    }
    if (iVar1 != 0) {
      return -0x386;
    }
  }
  return 0;
}

Assistant:

static int session_call_on_begin_headers(nghttp2_session *session,
                                         nghttp2_frame *frame) {
  int rv;
  DEBUGF("recv: call on_begin_headers callback stream_id=%d\n",
         frame->hd.stream_id);
  if (session->callbacks.on_begin_headers_callback) {
    rv = session->callbacks.on_begin_headers_callback(session, frame,
                                                      session->user_data);
    if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
      return rv;
    }
    if (rv != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}